

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDCLoader.cpp
# Opt level: O2

void Assimp::MDC::BuildVertex
               (Frame *frame,BaseVertex *bvert,CompressedVertex *cvert,aiVector3D *vXYZOut,
               aiVector3D *vNorOut)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = cvert->yd;
  bVar2 = cvert->zd;
  vXYZOut->x = ((float)(int)bvert->x + ((float)cvert->xd + -127.0) * 4.0) * 0.015625 +
               (frame->localOrigin).x;
  vXYZOut->y = ((float)(int)bvert->y + ((float)bVar1 + -127.0) * 4.0) * 0.015625 +
               (frame->localOrigin).y;
  vXYZOut->z = ((float)(int)bvert->z + ((float)bVar2 + -127.0) * 4.0) * 0.015625 +
               (frame->localOrigin).z;
  vNorOut->x = mdcNormals[cvert->nd][0];
  vNorOut->y = mdcNormals[cvert->nd][1];
  vNorOut->z = mdcNormals[cvert->nd][2];
  return;
}

Assistant:

void MDC::BuildVertex(const Frame& frame,
    const BaseVertex& bvert,
    const CompressedVertex& cvert,
    aiVector3D& vXYZOut,
    aiVector3D& vNorOut)
{
    // compute the position
    const float xd = (cvert.xd - AI_MDC_CVERT_BIAS) * AI_MDC_DELTA_SCALING;
    const float yd = (cvert.yd - AI_MDC_CVERT_BIAS) * AI_MDC_DELTA_SCALING;
    const float zd = (cvert.zd - AI_MDC_CVERT_BIAS) * AI_MDC_DELTA_SCALING;
    vXYZOut.x = frame.localOrigin.x + AI_MDC_BASE_SCALING * (bvert.x + xd);
    vXYZOut.y = frame.localOrigin.y + AI_MDC_BASE_SCALING * (bvert.y + yd);
    vXYZOut.z = frame.localOrigin.z + AI_MDC_BASE_SCALING * (bvert.z + zd);

    // compute the normal vector .. ehm ... lookup it in the table :-)
    vNorOut.x = mdcNormals[cvert.nd][0];
    vNorOut.y = mdcNormals[cvert.nd][1];
    vNorOut.z = mdcNormals[cvert.nd][2];
}